

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O2

spv_result_t spvtools::val::CheckIdDefinitionDominateUse(ValidationState_t *_)

{
  pointer pIVar1;
  pointer ppVar2;
  Instruction *pIVar3;
  Function *pFVar4;
  pointer ppIVar5;
  bool bVar6;
  Instruction *pIVar7;
  BasicBlock *pBVar8;
  spv_result_t sVar9;
  ulong uVar10;
  char *pcVar11;
  pointer ppVar12;
  Function *other;
  pointer pIVar13;
  pointer ppIVar14;
  __ireturn_type _Var15;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar16;
  Instruction *use;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  phi_instructions;
  string local_2a0;
  string local_280;
  string local_260;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  phi_ids;
  DiagnosticStream local_208;
  
  phi_instructions.
  super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phi_instructions.
  super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phi_instructions.
  super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phi_ids._M_h._M_buckets = &phi_ids._M_h._M_single_bucket;
  phi_ids._M_h._M_bucket_count = 1;
  phi_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  phi_ids._M_h._M_element_count = 0;
  phi_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  phi_ids._M_h._M_rehash_policy._M_next_resize = 0;
  phi_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar13 = (_->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (_->ordered_instructions_).
           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    ppIVar5 = phi_instructions.
              super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar14 = phi_instructions.
               super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (pIVar13 == pIVar1) {
      for (; ppIVar14 != ppIVar5; ppIVar14 = ppIVar14 + 1) {
        pIVar3 = *ppIVar14;
        if (pIVar3->block_->reachable_ == true) {
          for (uVar10 = 3;
              uVar10 < (ulong)((long)(pIVar3->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar3->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
              uVar10 = uVar10 + 2) {
            pIVar7 = ValidationState_t::FindDef
                               (_,(pIVar3->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10]);
            pVar16 = Function::GetBlock(pIVar3->function_,
                                        (pIVar3->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar10 + 1]);
            pBVar8 = pVar16.first;
            if (((pIVar7->block_ != (BasicBlock *)0x0) && (pBVar8->reachable_ == true)) &&
               (bVar6 = BasicBlock::dominates(pIVar7->block_,pBVar8), !bVar6)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar3);
              std::operator<<((ostream *)&local_208,"In OpPhi instruction ");
              ValidationState_t::getIdName_abi_cxx11_(&local_260,_,(pIVar3->inst_).result_id);
              std::operator<<((ostream *)&local_208,(string *)&local_260);
              std::operator<<((ostream *)&local_208,", ID ");
              ValidationState_t::getIdName_abi_cxx11_(&local_280,_,(pIVar7->inst_).result_id);
              std::operator<<((ostream *)&local_208,(string *)&local_280);
              std::operator<<((ostream *)&local_208," definition does not dominate its parent ");
              ValidationState_t::getIdName_abi_cxx11_(&local_2a0,_,pBVar8->id_);
              std::operator<<((ostream *)&local_208,(string *)&local_2a0);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              sVar9 = local_208.error_;
              goto LAB_001b273b;
            }
          }
        }
      }
      sVar9 = SPV_SUCCESS;
LAB_001b2740:
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&phi_ids._M_h);
      std::
      _Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
      ::~_Vector_base(&phi_instructions.
                       super__Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                     );
      return sVar9;
    }
    if (((pIVar13->inst_).result_id != 0) && (other = pIVar13->function_, other != (Function *)0x0))
    {
      pBVar8 = pIVar13->block_;
      ppVar12 = (pIVar13->uses_).
                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (pIVar13->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar8 == (BasicBlock *)0x0) {
        while (ppVar12 != ppVar2) {
          pIVar3 = ppVar12->first;
          pFVar4 = pIVar3->function_;
          ppVar12 = ppVar12 + 1;
          if ((pFVar4 != (Function *)0x0) && (pFVar4 != other)) {
            pIVar7 = ValidationState_t::FindDef(_,other->id_);
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar7);
            std::operator<<((ostream *)&local_208,"ID ");
            ValidationState_t::getIdName_abi_cxx11_(&local_260,_,(pIVar13->inst_).result_id);
            std::operator<<((ostream *)&local_208,(string *)&local_260);
            std::operator<<((ostream *)&local_208," used in function ");
            ValidationState_t::getIdName_abi_cxx11_(&local_280,_,pIVar3->function_->id_);
            std::operator<<((ostream *)&local_208,(string *)&local_280);
            pcVar11 = " is used outside of it\'s defining function ";
            goto LAB_001b26f2;
          }
        }
      }
      else {
        for (; ppVar12 != ppVar2; ppVar12 = ppVar12 + 1) {
          use = ppVar12->first;
          other = (Function *)use->block_;
          if ((other != (Function *)0x0) &&
             (*(char *)&(other->ordered_blocks_).
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish == '\x01')) {
            if ((use->inst_).opcode == 0xf5) {
              local_208._0_4_ = (use->inst_).result_id;
              _Var15 = std::__detail::
                       _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                       ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                                 *)&phi_ids,(value_type *)&local_208);
              if (((undefined1  [16])_Var15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::
                vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                ::push_back(&phi_instructions,&use);
              }
            }
            else {
              bVar6 = BasicBlock::dominates(pBVar8,(BasicBlock *)other);
              if (!bVar6) {
                ValidationState_t::diag
                          (&local_208,_,SPV_ERROR_INVALID_ID,
                           (Instruction *)
                           (other->ordered_blocks_).
                           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::operator<<((ostream *)&local_208,"ID ");
                ValidationState_t::getIdName_abi_cxx11_(&local_260,_,(pIVar13->inst_).result_id);
                std::operator<<((ostream *)&local_208,(string *)&local_260);
                std::operator<<((ostream *)&local_208," defined in block ");
                ValidationState_t::getIdName_abi_cxx11_(&local_280,_,pBVar8->id_);
                std::operator<<((ostream *)&local_208,(string *)&local_280);
                pcVar11 = " does not dominate its use in block ";
LAB_001b26f2:
                std::operator<<((ostream *)&local_208,pcVar11);
                ValidationState_t::getIdName_abi_cxx11_(&local_2a0,_,other->id_);
                std::operator<<((ostream *)&local_208,(string *)&local_2a0);
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                sVar9 = local_208.error_;
LAB_001b273b:
                DiagnosticStream::~DiagnosticStream(&local_208);
                goto LAB_001b2740;
              }
            }
          }
        }
      }
    }
    pIVar13 = pIVar13 + 1;
  } while( true );
}

Assistant:

spv_result_t CheckIdDefinitionDominateUse(ValidationState_t& _) {
  std::vector<const Instruction*> phi_instructions;
  std::unordered_set<uint32_t> phi_ids;
  for (const auto& inst : _.ordered_instructions()) {
    if (inst.id() == 0) continue;
    if (const Function* func = inst.function()) {
      if (const BasicBlock* block = inst.block()) {
        // If the Id is defined within a block then make sure all references to
        // that Id appear in a blocks that are dominated by the defining block
        for (auto& use_index_pair : inst.uses()) {
          const Instruction* use = use_index_pair.first;
          if (const BasicBlock* use_block = use->block()) {
            if (use_block->reachable() == false) continue;
            if (use->opcode() == spv::Op::OpPhi) {
              if (phi_ids.insert(use->id()).second) {
                phi_instructions.push_back(use);
              }
            } else if (!block->dominates(*use->block())) {
              return _.diag(SPV_ERROR_INVALID_ID, use_block->label())
                     << "ID " << _.getIdName(inst.id()) << " defined in block "
                     << _.getIdName(block->id())
                     << " does not dominate its use in block "
                     << _.getIdName(use_block->id());
            }
          }
        }
      } else {
        // If the Ids defined within a function but not in a block(i.e. function
        // parameters, block ids), then make sure all references to that Id
        // appear within the same function
        for (auto use : inst.uses()) {
          const Instruction* user = use.first;
          if (user->function() && user->function() != func) {
            return _.diag(SPV_ERROR_INVALID_ID, _.FindDef(func->id()))
                   << "ID " << _.getIdName(inst.id()) << " used in function "
                   << _.getIdName(user->function()->id())
                   << " is used outside of it's defining function "
                   << _.getIdName(func->id());
          }
        }
      }
    }
    // NOTE: Ids defined outside of functions must appear before they are used
    // This check is being performed in the IdPass function
  }

  // Check all OpPhi parent blocks are dominated by the variable's defining
  // blocks
  for (const Instruction* phi : phi_instructions) {
    if (phi->block()->reachable() == false) continue;
    for (size_t i = 3; i < phi->operands().size(); i += 2) {
      const Instruction* variable = _.FindDef(phi->word(i));
      const BasicBlock* parent =
          phi->function()->GetBlock(phi->word(i + 1)).first;
      if (variable->block() && parent->reachable() &&
          !variable->block()->dominates(*parent)) {
        return _.diag(SPV_ERROR_INVALID_ID, phi)
               << "In OpPhi instruction " << _.getIdName(phi->id()) << ", ID "
               << _.getIdName(variable->id())
               << " definition does not dominate its parent "
               << _.getIdName(parent->id());
      }
    }
  }

  return SPV_SUCCESS;
}